

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpk.c
# Opt level: O0

XPK * XPK_NewFromFile(FILE *f,LPStatus *status)

{
  _Bool _Var1;
  XPKEntry **ppXVar2;
  long lVar3;
  uint32_t *puVar4;
  uint32_t local_4c;
  uint32_t absolute_offset;
  uint32_t offset;
  int i_1;
  uint32_t offsets_start_pos;
  XPKEntry *entry;
  ushort local_30;
  ushort local_2e;
  uint16_t y;
  uint16_t x;
  uint16_t height;
  uint16_t width;
  int i;
  XPK *xpk;
  LPStatus *status_local;
  FILE *f_local;
  
  xpk = (XPK *)status;
  status_local = (LPStatus *)f;
  _Var1 = ValidateMagicF(f,XPK_MAGIC,4);
  if (_Var1) {
    _height = (FILE *)malloc(0x30);
    if (_height == (FILE *)0x0) {
      free((void *)0x0);
      *(undefined4 *)&xpk->file = 1;
      f_local = (FILE *)0x0;
    }
    else {
      _height->_IO_read_base = (char *)0x0;
      *(LPStatus **)_height = status_local;
      ReadUint8((FILE *)status_local,2,(uint8_t *)&_height->_IO_read_ptr);
      ReadUint16((FILE *)status_local,1,(uint16_t *)((long)&_height->_IO_read_ptr + 2));
      *(int *)((long)&_height->_IO_read_ptr + 4) = 0;
      fseek((FILE *)status_local,4,1);
      ReadUint32((FILE *)status_local,1,(uint32_t *)&_height->_IO_read_end);
      ppXVar2 = (XPKEntry **)calloc((ulong)*(uint16_t *)((long)&_height->_IO_read_ptr + 2),0x20);
      _height->_IO_write_ptr = (char *)ppXVar2;
      for (_y = 0; _y < (int)(uint)*(uint16_t *)((long)&_height->_IO_read_ptr + 2); _y = _y + 1) {
        fseek((FILE *)status_local,8,1);
        ReadUint16((FILE *)status_local,1,(uint16_t *)((long)&entry + 6));
        ReadUint16((FILE *)status_local,1,(uint16_t *)((long)&entry + 4));
        ReadUint16((FILE *)status_local,1,&local_2e);
        ReadUint16((FILE *)status_local,1,&local_30);
        _i_1 = XPKEntry_New((ulong)local_2e,(ulong)local_30,(uint)entry._6_2_,(uint)entry._4_2_);
        _i_1->xpk = (XPK *)_height;
        if (_i_1 == (XPKEntry *)0x0) {
          *(undefined4 *)&xpk->file = 1;
          fclose((FILE *)status_local);
          return (XPK *)0x0;
        }
        *(XPKEntry **)((long)_height->_IO_write_ptr + (long)_y * 8) = _i_1;
      }
      lVar3 = ftell((FILE *)status_local);
      offset = (uint32_t)lVar3;
      puVar4 = (uint32_t *)calloc((ulong)*(uint16_t *)((long)&_height->_IO_read_ptr + 2),4);
      _height->_IO_write_base = (char *)puVar4;
      for (absolute_offset = 0;
          (int)absolute_offset < (int)(uint)*(uint16_t *)((long)&_height->_IO_read_ptr + 2);
          absolute_offset = absolute_offset + 1) {
        ReadUint32((FILE *)status_local,1,&local_4c);
        *(uint32_t *)((long)_height->_IO_write_base + (long)(int)absolute_offset * 4) =
             offset + local_4c;
        (*(XPKEntry **)((long)_height->_IO_write_ptr + (long)(int)absolute_offset * 8))->offset =
             offset + local_4c;
      }
      *(undefined4 *)&xpk->file = 0;
      f_local = _height;
    }
  }
  else {
    *(undefined4 *)&xpk->file = 3;
    f_local = (FILE *)0x0;
  }
  return (XPK *)f_local;
}

Assistant:

XPK *
XPK_NewFromFile(FILE *f, LPStatus *status)
{
	if (!ValidateMagicF(f, XPK_MAGIC, XPK_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		return NULL;
	}

	XPK *xpk = malloc(sizeof(XPK));

	/* XXX should explain bad malloc */
	if (!xpk) {
		free(xpk);
		*status = LUNAPURPURA_ERROR;
		return NULL;
	}

	xpk->clu = NULL;
	xpk->file = f;

	ReadUint8(f, 2, xpk->co2);
	ReadUint16(f, 1, &xpk->n_entries);
	xpk->a = 0; /* XXX dunno */
	fseek(f, 4L, SEEK_CUR);
	ReadUint32(f, 1, &xpk->next_section);

	xpk->entries = calloc(xpk->n_entries, sizeof(XPKEntry));

	for (int i = 0; i < xpk->n_entries; i++) {
		uint16_t width;
		uint16_t height;
		uint16_t x;
		uint16_t y;

		fseek(f, 8L, SEEK_CUR); /* Ignore first 4 numbers ("x1", "x2", "w1", "w2") */
		ReadUint16(f, 1, &x);
		ReadUint16(f, 1, &y);
		ReadUint16(f, 1, &width);
		ReadUint16(f, 1, &height);

		XPKEntry *entry = XPKEntry_New(width, height, x, y);
		entry->xpk = xpk;

		if (!entry) {
			*status = LUNAPURPURA_ERROR;
			fclose(f);
			return NULL;
		}

		xpk->entries[i] = entry;
	}

	/*
	 * The offsets which are listed in the XPK file are not absolute, they are
	 * relative to this position right here. But we'll go ahead and store the
	 * absolute offsets in the XPK struct we're trying to create. (Nothing
	 * wrong with that, right?)
	 *
	 * While generating this list, we'll enrich each of the XPKEntries we
	 * created earlier with this new info.
	 */
	uint32_t offsets_start_pos = ftell(f);

	/* XXX check for malloc error */
	xpk->offsets = calloc(xpk->n_entries, sizeof(uint32_t));

	for (int i = 0; i < xpk->n_entries; i++) {
		uint32_t offset;
		ReadUint32(f, 1, &offset);
		uint32_t absolute_offset = offsets_start_pos + offset;
		xpk->offsets[i] = absolute_offset;
		xpk->entries[i]->offset = absolute_offset;
	}

	*status = LUNAPURPURA_OK;
	return xpk;
}